

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O0

void Abc_FlowRetime_ClearFlows(int fClearAll)

{
  int local_10;
  int i;
  int fClearAll_local;
  
  if (fClearAll == 0) {
    for (local_10 = 0; local_10 < pManMR->nNodes; local_10 = local_10 + 1) {
      *(ushort *)(pManMR->pDataArray + local_10) =
           *(ushort *)(pManMR->pDataArray + local_10) & 0xfff8;
      *(uint *)&pManMR->pDataArray[local_10].field_0x10 =
           *(uint *)&pManMR->pDataArray[local_10].field_0x10 & 0xffff0000;
      *(uint *)&pManMR->pDataArray[local_10].field_0x10 =
           *(uint *)&pManMR->pDataArray[local_10].field_0x10 & 0xffff;
      pManMR->pDataArray[local_10].field_1.pred = (Abc_Obj_t *)0x0;
    }
  }
  else {
    memset(pManMR->pDataArray,0,(long)pManMR->nNodes * 0x18);
  }
  return;
}

Assistant:

void Abc_FlowRetime_ClearFlows( int fClearAll ) {
  int i;

  if (fClearAll)
    memset(pManMR->pDataArray, 0, sizeof(Flow_Data_t)*pManMR->nNodes);
  else {
    // clear only data related to flow problem
    for(i=0; i<pManMR->nNodes; i++) {
      pManMR->pDataArray[i].mark &= ~(VISITED | FLOW );
      pManMR->pDataArray[i].e_dist = 0;
      pManMR->pDataArray[i].r_dist = 0;
      pManMR->pDataArray[i].pred = NULL;
    }
  }
}